

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Dmc::write_register(Nes_Dmc *this,int addr,int data)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  if (addr == 1) {
    iVar1 = this->dac;
    uVar2 = data & 0x7f;
    this->dac = uVar2;
    if (this->nonlinear == false) {
      (this->super_Nes_Osc).last_amp = (""[iVar1] + uVar2) - (uint)""[uVar2];
    }
  }
  else if (addr == 0) {
    this->period = (int)dmc_period_table[this->pal_mode][data & 0xf];
    bVar3 = (data & 0xc0U) == 0x80;
    this->irq_enabled = bVar3;
    this->irq_flag = (bool)(this->irq_flag & bVar3);
    recalc_irq(this);
    return;
  }
  return;
}

Assistant:

void Nes_Dmc::write_register( int addr, int data )
{
	if ( addr == 0 )
	{
		period = dmc_period_table [pal_mode] [data & 15];
		irq_enabled = (data & 0xC0) == 0x80; // enabled only if loop disabled
		irq_flag &= irq_enabled;
		recalc_irq();
	}
	else if ( addr == 1 )
	{
		int old_dac = dac;
		dac = data & 0x7F;
		
		// adjust last_amp so that "pop" amplitude will be properly non-linear
		// with respect to change in dac
		int faked_nonlinear = dac - (dac_table [dac] - dac_table [old_dac]);
		if ( !nonlinear )
			last_amp = faked_nonlinear;
	}
}